

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int ncnn::gru(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  long *in_RCX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  long *in_R9;
  float fVar5;
  double dVar6;
  double dVar7;
  long *in_stack_00000008;
  long in_stack_00000010;
  float H;
  float N_1;
  float U_1;
  float *gates_data_1;
  int q_1;
  float *output_data;
  float xi_1;
  int i_3;
  float h_cont_1;
  int i_2;
  float N;
  float *weight_hc_N;
  float *weight_xc_N;
  float *bias_c_BN;
  float *bias_c_WN;
  float h_cont;
  int i_1;
  float xi;
  int i;
  float U;
  float R;
  float *weight_hc_U;
  float *weight_hc_R;
  float *weight_xc_U;
  float *weight_xc_R;
  float *bias_c_U;
  float *bias_c_R;
  float *gates_data;
  int q;
  float *x;
  int ti;
  int t;
  Mat gates;
  int num_output;
  int T;
  int size;
  Allocator *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined8 in_stack_fffffffffffffc48;
  Mat *in_stack_fffffffffffffc50;
  int local_31c;
  int local_2dc;
  int local_2c8;
  int local_2c0;
  float local_2bc;
  int local_294;
  int local_28c;
  float local_288;
  float local_284;
  int local_244;
  int local_234;
  void *local_220;
  int *local_218;
  long local_210;
  undefined4 local_208;
  long *local_200;
  undefined4 local_1f8;
  int local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  int local_1e8;
  long local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long *local_1c8;
  long *local_1c0;
  long *local_1b8;
  int local_1ac;
  long *local_1a8;
  long *local_1a0;
  int local_194;
  void **local_190;
  void **local_180;
  undefined8 local_178;
  undefined8 local_170;
  int local_168;
  undefined4 local_164;
  void **local_160;
  int local_154;
  void **local_150;
  int local_144;
  long *local_140;
  int local_134;
  void **local_130;
  int local_118;
  undefined4 local_114;
  void **local_110;
  void *local_108;
  void **local_f8;
  int local_ec;
  long *local_e8;
  int local_dc;
  long *local_d8;
  undefined4 local_cc;
  long *local_c8;
  undefined4 local_bc;
  long *local_b8;
  int local_ac;
  long *local_a8;
  int local_9c;
  long *local_98;
  int local_8c;
  long *local_88;
  int local_7c;
  long *local_78;
  undefined4 local_6c;
  long *local_68;
  undefined4 local_5c;
  long *local_58;
  int local_4c;
  long *local_48;
  long local_40;
  long local_30;
  long local_20;
  long local_10;
  
  local_1cc = *(int *)((long)in_RDI + 0x2c);
  local_1d0 = (int)in_RDI[6];
  local_1d4 = *(int *)((long)in_RSI + 0x2c);
  local_178 = *(undefined8 *)(in_stack_00000010 + 0x10);
  local_160 = &local_220;
  local_164 = 2;
  local_170 = 4;
  local_220 = (void *)0x0;
  local_218 = (int *)0x0;
  local_210 = 0;
  local_208 = 0;
  local_200 = (long *)0x0;
  local_1f8 = 0;
  local_1f4 = 0;
  local_1f0 = 0;
  local_1ec = 0;
  local_1e8 = 0;
  local_1e0 = 0;
  local_1c8 = in_R9;
  local_1c0 = in_R8;
  local_1b8 = in_RCX;
  local_1ac = in_EDX;
  local_1a8 = in_RSI;
  local_1a0 = in_RDI;
  local_168 = local_1d4;
  Mat::create(in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
              (int)in_stack_fffffffffffffc48,
              CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
              in_stack_fffffffffffffc38);
  local_180 = &local_220;
  if (local_220 != (void *)0x0) {
    local_f8 = local_180;
  }
  if (local_220 != (void *)0x0 && local_1e0 * local_1e8 != 0) {
    for (local_234 = 0; local_234 < local_1d0; local_234 = local_234 + 1) {
      if (local_1ac == 0) {
        local_31c = local_234;
      }
      else {
        local_31c = (local_1d0 + -1) - local_234;
      }
      local_48 = local_1a0;
      local_4c = local_31c;
      lVar3 = *local_1a0 + (long)*(int *)((long)local_1a0 + 0x2c) * (long)local_31c * local_1a0[2];
      for (local_244 = 0; local_244 < local_1d4; local_244 = local_244 + 1) {
        local_130 = &local_220;
        local_134 = local_244;
        pfVar4 = (float *)((long)local_220 + (long)local_1f4 * (long)local_244 * local_210);
        local_58 = local_1c0;
        local_5c = 0;
        local_68 = local_1c0;
        local_6c = 1;
        local_78 = local_1b8;
        local_7c = local_244;
        local_8c = local_1d4 + local_244;
        local_88 = local_1b8;
        local_98 = local_1c8;
        local_9c = local_244;
        local_ac = local_1d4 + local_244;
        local_a8 = local_1c8;
        local_284 = *(float *)(*local_1c0 + (long)local_244 * 4);
        local_288 = *(float *)(*local_1c0 + (long)*(int *)((long)local_1c0 + 0x2c) * local_1c0[2] +
                              (long)local_244 * 4);
        for (local_28c = 0; local_28c < local_1cc; local_28c = local_28c + 1) {
          fVar5 = *(float *)(lVar3 + (long)local_28c * 4);
          local_284 = *(float *)(*local_1b8 +
                                 (long)*(int *)((long)local_1b8 + 0x2c) * (long)local_244 *
                                 local_1b8[2] + (long)local_28c * 4) * fVar5 + local_284;
          local_288 = *(float *)(*local_1b8 +
                                 (long)*(int *)((long)local_1b8 + 0x2c) * (long)local_8c *
                                 local_1b8[2] + (long)local_28c * 4) * fVar5 + local_288;
        }
        for (local_294 = 0; local_294 < local_1d4; local_294 = local_294 + 1) {
          local_10 = (long)local_294;
          fVar5 = *(float *)(*in_stack_00000008 + local_10 * 4);
          local_284 = *(float *)(*local_1c8 +
                                 (long)*(int *)((long)local_1c8 + 0x2c) * (long)local_244 *
                                 local_1c8[2] + (long)local_294 * 4) * fVar5 + local_284;
          local_288 = *(float *)(*local_1c8 +
                                 (long)*(int *)((long)local_1c8 + 0x2c) * (long)local_ac *
                                 local_1c8[2] + (long)local_294 * 4) * fVar5 + local_288;
        }
        dVar6 = std::exp((double)((ulong)(uint)local_284 ^ 0x8000000080000000));
        dVar7 = std::exp((double)((ulong)(uint)local_288 ^ 0x8000000080000000));
        local_b8 = local_1c0;
        local_bc = 2;
        local_c8 = local_1c0;
        local_cc = 3;
        local_dc = local_1d4 * 2 + local_244;
        local_d8 = local_1b8;
        local_ec = local_1d4 * 2 + local_244;
        local_e8 = local_1c8;
        local_2bc = *(float *)(*local_1c0 +
                               (long)*(int *)((long)local_1c0 + 0x2c) * 3 * local_1c0[2] +
                              (long)local_244 * 4);
        for (local_2c0 = 0; local_2c0 < local_1d4; local_2c0 = local_2c0 + 1) {
          local_20 = (long)local_2c0;
          local_2bc = *(float *)(*local_1c8 +
                                 (long)*(int *)((long)local_1c8 + 0x2c) * (long)local_ec *
                                 local_1c8[2] + (long)local_2c0 * 4) *
                      *(float *)(*in_stack_00000008 + local_20 * 4) + local_2bc;
        }
        local_2bc = *(float *)(*local_1c0 +
                               (long)*(int *)((long)local_1c0 + 0x2c) * 2 * local_1c0[2] +
                              (long)local_244 * 4) + (1.0 / (SUB84(dVar6,0) + 1.0)) * local_2bc;
        for (local_2c8 = 0; local_2c8 < local_1cc; local_2c8 = local_2c8 + 1) {
          local_2bc = *(float *)(*local_1b8 +
                                 (long)*(int *)((long)local_1b8 + 0x2c) * (long)local_dc *
                                 local_1b8[2] + (long)local_2c8 * 4) *
                      *(float *)(lVar3 + (long)local_2c8 * 4) + local_2bc;
        }
        dVar6 = std::tanh((double)(ulong)(uint)local_2bc);
        *pfVar4 = 1.0 / (SUB84(dVar7,0) + 1.0);
        pfVar4[1] = SUB84(dVar6,0);
      }
      local_140 = local_1a8;
      local_144 = local_31c;
      lVar3 = *local_1a8;
      iVar1 = *(int *)((long)local_1a8 + 0x2c);
      lVar2 = local_1a8[2];
      for (local_2dc = 0; local_2dc < local_1d4; local_2dc = local_2dc + 1) {
        local_154 = local_2dc;
        local_150 = &local_220;
        pfVar4 = (float *)((long)local_220 + (long)local_1f4 * (long)local_2dc * local_210);
        fVar5 = *pfVar4;
        local_30 = (long)local_2dc;
        fVar5 = (1.0 - fVar5) * pfVar4[1] + fVar5 * *(float *)(*in_stack_00000008 + local_30 * 4);
        local_40 = (long)local_2dc;
        *(float *)(*in_stack_00000008 + local_40 * 4) = fVar5;
        *(float *)(lVar3 + (long)iVar1 * (long)local_31c * lVar2 + (long)local_2dc * 4) = fVar5;
      }
    }
    local_194 = 0;
  }
  else {
    local_194 = -100;
  }
  local_190 = &local_220;
  if (local_218 != (int *)0x0) {
    local_114 = 0xffffffff;
    LOCK();
    local_118 = *local_218;
    *local_218 = *local_218 + -1;
    UNLOCK();
    if (local_118 == 1) {
      local_110 = local_190;
      if (local_200 == (long *)0x0) {
        local_108 = local_220;
        if (local_220 != (void *)0x0) {
          free(local_220);
        }
      }
      else {
        (**(code **)(*local_200 + 0x18))(local_200,local_220);
      }
    }
  }
  return local_194;
}

Assistant:

static int gru(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const float* weight_xc_R = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_U = weight_xc.row(num_output * 1 + q);
            const float* weight_hc_R = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_U = weight_hc.row(num_output * 1 + q);

            float R = bias_c_R[q];
            float U = bias_c_U[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                R += weight_xc_R[i] * xi;
                U += weight_xc_U[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                R += weight_hc_R[i] * h_cont;
                U += weight_hc_U[i] * h_cont;
            }

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + exp(-R));
            U = 1.f / (1.f + exp(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const float* weight_xc_N = weight_xc.row(num_output * 2 + q);
            const float* weight_hc_N = weight_hc.row(num_output * 2 + q);

            float N = bias_c_BN[q];

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                N += weight_hc_N[i] * h_cont;
            }

            N = bias_c_WN[q] + R * N;

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                N += weight_xc_N[i] * xi;
            }

            // tanh(N)
            N = tanh(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}